

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::DiagnosticsReporter::diagnoseOrDelayDiagnostic
          (DiagnosticsReporter *this,DiagnosticDescriptor *desc)

{
  SyntaxTree *this_00;
  bool bVar1;
  key_type *__x;
  DiagnosticDescriptor local_180;
  pair<psy::DiagnosticDescriptor,_unsigned_int> local_108;
  pair<psy::DiagnosticDescriptor,_unsigned_long> local_98;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_28;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_20;
  DiagnosticDescriptor *local_18;
  DiagnosticDescriptor *desc_local;
  DiagnosticsReporter *this_local;
  
  local_18 = desc;
  desc_local = (DiagnosticDescriptor *)this;
  bVar1 = willBacktrack(this->parser_);
  if (!bVar1) {
    __x = (key_type *)psy::DiagnosticDescriptor::id_abi_cxx11_();
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->IDsForDelay_,__x);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->IDsForDelay_);
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (bVar1) {
      std::make_pair<psy::DiagnosticDescriptor&,unsigned_int&>
                (&local_108,local_18,&this->parser_->curTkIdx_);
      std::pair<psy::DiagnosticDescriptor,_unsigned_long>::
      pair<psy::DiagnosticDescriptor,_unsigned_int,_true>(&local_98,&local_108);
      std::
      vector<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
      ::push_back(&this->delayedDiags_,&local_98);
      std::pair<psy::DiagnosticDescriptor,_unsigned_long>::~pair(&local_98);
      std::pair<psy::DiagnosticDescriptor,_unsigned_int>::~pair(&local_108);
    }
    else {
      this_00 = this->parser_->tree_;
      DiagnosticDescriptor::DiagnosticDescriptor(&local_180,local_18);
      SyntaxTree::newDiagnostic(this_00,&local_180,(ulong)this->parser_->curTkIdx_);
      DiagnosticDescriptor::~DiagnosticDescriptor(&local_180);
    }
  }
  return;
}

Assistant:

void Parser::DiagnosticsReporter::diagnoseOrDelayDiagnostic(DiagnosticDescriptor&& desc)
{
    if (parser_->willBacktrack())
        return;

    if (IDsForDelay_.find(desc.id()) != IDsForDelay_.end())
        delayedDiags_.push_back(std::make_pair(desc, parser_->curTkIdx_));
    else
        parser_->tree_->newDiagnostic(desc, parser_->curTkIdx_);
}